

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void __thiscall
Kss_Emu::set_voice(Kss_Emu *this,int i,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  Blip_Buffer *in_RCX;
  Blip_Buffer *in_RDX;
  int in_ESI;
  long in_RDI;
  Blip_Buffer *in_R8;
  int i2;
  
  if (in_ESI + -3 < 0) {
    Ay_Apu::osc_output((Ay_Apu *)(in_RDI + 0x105f0),in_ESI,in_RDX);
  }
  else {
    Scc_Apu::osc_output((Scc_Apu *)(in_RDI + 0x10b20),in_ESI + -3,in_RDX);
  }
  if ((*(long *)(in_RDI + 0x10e60) != 0) && (in_ESI < 4)) {
    Sms_Apu::osc_output(*(Sms_Apu **)(in_RDI + 0x10e60),in_ESI,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

void Kss_Emu::set_voice( int i, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	int i2 = i - ay.osc_count;
	if ( i2 >= 0 )
		scc.osc_output( i2, center );
	else
		ay.osc_output( i, center );
	if ( sn && i < sn->osc_count )
		sn->osc_output( i, center, left, right );
}